

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandStrash(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pObj_00;
  char *pcVar4;
  uint local_50;
  int fComplOuts;
  int fCleanup;
  int fRecord;
  int fAllNodes;
  int c;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  fCleanup = 0;
  local_50 = 1;
  fComplOuts = 0;
  bVar1 = false;
  Extra_UtilGetoptReset();
LAB_00229773:
  iVar2 = Extra_UtilGetopt(argc,argv,"acrih");
  if (iVar2 == -1) {
    if (pAVar3 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      pAVar3 = Abc_NtkStrash(pAVar3,fCleanup,local_50,fComplOuts);
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Strashing has failed.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        if (bVar1) {
          for (fRecord = 0; iVar2 = Abc_NtkPoNum(pAVar3), fRecord < iVar2; fRecord = fRecord + 1) {
            pObj_00 = Abc_NtkPo(pAVar3,fRecord);
            Abc_ObjXorFaninC(pObj_00,0);
          }
        }
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
        pAbc_local._4_4_ = 0;
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar2) {
  case 0x61:
    fCleanup = fCleanup ^ 1;
    goto LAB_00229773;
  default:
    break;
  case 99:
    local_50 = local_50 ^ 1;
    goto LAB_00229773;
  case 0x68:
    break;
  case 0x69:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_00229773;
  case 0x72:
    goto switchD_002297b1_caseD_72;
  }
  Abc_Print(-2,"usage: strash [-acrih]\n");
  Abc_Print(-2,"\t        transforms combinational logic into an AIG\n");
  pcVar4 = "DFS";
  if (fCleanup != 0) {
    pcVar4 = "all";
  }
  Abc_Print(-2,"\t-a    : toggles between using all nodes and DFS nodes [default = %s]\n",pcVar4);
  pcVar4 = "DFS";
  if (local_50 != 0) {
    pcVar4 = "all";
  }
  Abc_Print(-2,"\t-c    : toggles cleanup to remove the dagling AIG nodes [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (fComplOuts != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-r    : toggles using the record of AIG subgraphs [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-i    : toggles complementing the POs of the AIG [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
switchD_002297b1_caseD_72:
  fComplOuts = fComplOuts ^ 1;
  goto LAB_00229773;
}

Assistant:

int Abc_CommandStrash( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    Abc_Obj_t * pObj;
    int c;
    int fAllNodes;
    int fRecord;
    int fCleanup;
    int fComplOuts;
    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fAllNodes = 0;
    fCleanup  = 1;
    fRecord   = 0;
    fComplOuts= 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "acrih" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fAllNodes ^= 1;
            break;
        case 'c':
            fCleanup ^= 1;
            break;
        case 'r':
            fRecord ^= 1;
            break;
        case 'i':
            fComplOuts ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    // get the new network
    pNtkRes = Abc_NtkStrash( pNtk, fAllNodes, fCleanup, fRecord );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Strashing has failed.\n" );
        return 1;
    }
    if ( fComplOuts )
    Abc_NtkForEachPo( pNtkRes, pObj, c )
        Abc_ObjXorFaninC( pObj, 0 );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: strash [-acrih]\n" );
    Abc_Print( -2, "\t        transforms combinational logic into an AIG\n" );
    Abc_Print( -2, "\t-a    : toggles between using all nodes and DFS nodes [default = %s]\n", fAllNodes? "all": "DFS" );
    Abc_Print( -2, "\t-c    : toggles cleanup to remove the dagling AIG nodes [default = %s]\n", fCleanup? "all": "DFS" );
    Abc_Print( -2, "\t-r    : toggles using the record of AIG subgraphs [default = %s]\n", fRecord? "yes": "no" );
    Abc_Print( -2, "\t-i    : toggles complementing the POs of the AIG [default = %s]\n", fComplOuts? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}